

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# depfile_parser_perftest.cc
# Opt level: O0

int main(int argc,char **argv)

{
  char *__s;
  bool bVar1;
  int iVar2;
  int64_t iVar3;
  undefined8 uVar4;
  reference pvVar5;
  size_type sVar6;
  float local_17c;
  ulong local_130;
  size_t i_1;
  float local_120;
  float total;
  float max;
  float min;
  float time;
  int delta;
  int64_t end;
  undefined1 local_100 [8];
  DepfileParser parser;
  string local_c0;
  undefined1 local_a0 [8];
  string err;
  string buf;
  int rep;
  int local_50;
  int64_t start;
  int limit;
  char *filename;
  undefined1 local_30 [4];
  int i;
  vector<float,_std::allocator<float>_> times;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  times.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)argv;
  if (argc < 2) {
    printf("usage: %s <file1> <file2...>\n",*argv);
    argv_local._4_4_ = 1;
  }
  else {
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)local_30);
    for (filename._4_4_ = 1; filename._4_4_ < argc; filename._4_4_ = filename._4_4_ + 1) {
      __s = *(char **)(times.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + (long)filename._4_4_ * 2);
      for (start._4_4_ = 0x400; start._4_4_ < 0x100000; start._4_4_ = start._4_4_ << 1) {
        iVar3 = GetTimeMillis();
        for (buf.field_2._8_4_ = 0; (int)buf.field_2._8_4_ < start._4_4_;
            buf.field_2._8_4_ = buf.field_2._8_4_ + 1) {
          std::__cxx11::string::string((string *)(err.field_2._M_local_buf + 8));
          std::__cxx11::string::string((string *)local_a0);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_c0,__s,(allocator<char> *)&parser.field_0x37);
          iVar2 = ReadFile(&local_c0,(string *)((long)&err.field_2 + 8),(string *)local_a0);
          std::__cxx11::string::~string((string *)&local_c0);
          std::allocator<char>::~allocator((allocator<char> *)&parser.field_0x37);
          if (iVar2 < 0) {
            uVar4 = std::__cxx11::string::c_str();
            printf("%s: %s\n",__s,uVar4);
            argv_local._4_4_ = 1;
            parser.options_ = (DepfileParserOptions)0x1;
            parser._49_3_ = 0;
          }
          else {
            DepfileParserOptions::DepfileParserOptions((DepfileParserOptions *)((long)&end + 7));
            DepfileParser::DepfileParser((DepfileParser *)local_100);
            bVar1 = DepfileParser::Parse
                              ((DepfileParser *)local_100,(string *)((long)&err.field_2 + 8),
                               (string *)local_a0);
            if (!bVar1) {
              uVar4 = std::__cxx11::string::c_str();
              printf("%s: %s\n",__s,uVar4);
              argv_local._4_4_ = 1;
            }
            parser._49_3_ = 0;
            parser.options_ = (DepfileParserOptions)!bVar1;
            DepfileParser::~DepfileParser((DepfileParser *)local_100);
          }
          std::__cxx11::string::~string((string *)local_a0);
          std::__cxx11::string::~string((string *)(err.field_2._M_local_buf + 8));
          if (parser._48_4_ != 0) goto LAB_00107444;
        }
        _time = GetTimeMillis();
        if (100 < _time - iVar3) {
          local_50 = (int)iVar3;
          min = (float)((int)time - local_50);
          max = (float)((int)min * 1000) / (float)start._4_4_;
          printf("%s: %.1fus\n",(double)max,__s);
          std::vector<float,_std::allocator<float>_>::push_back
                    ((vector<float,_std::allocator<float>_> *)local_30,&max);
          break;
        }
      }
    }
    bVar1 = std::vector<float,_std::allocator<float>_>::empty
                      ((vector<float,_std::allocator<float>_> *)local_30);
    if (!bVar1) {
      pvVar5 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)local_30,0);
      total = *pvVar5;
      pvVar5 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)local_30,0);
      local_120 = *pvVar5;
      i_1._4_4_ = 0.0;
      for (local_130 = 0;
          sVar6 = std::vector<float,_std::allocator<float>_>::size
                            ((vector<float,_std::allocator<float>_> *)local_30), local_130 < sVar6;
          local_130 = local_130 + 1) {
        pvVar5 = std::vector<float,_std::allocator<float>_>::operator[]
                           ((vector<float,_std::allocator<float>_> *)local_30,local_130);
        i_1._4_4_ = *pvVar5 + i_1._4_4_;
        pvVar5 = std::vector<float,_std::allocator<float>_>::operator[]
                           ((vector<float,_std::allocator<float>_> *)local_30,local_130);
        if (total <= *pvVar5) {
          pvVar5 = std::vector<float,_std::allocator<float>_>::operator[]
                             ((vector<float,_std::allocator<float>_> *)local_30,local_130);
          if (local_120 < *pvVar5) {
            pvVar5 = std::vector<float,_std::allocator<float>_>::operator[]
                               ((vector<float,_std::allocator<float>_> *)local_30,local_130);
            local_120 = *pvVar5;
          }
        }
        else {
          pvVar5 = std::vector<float,_std::allocator<float>_>::operator[]
                             ((vector<float,_std::allocator<float>_> *)local_30,local_130);
          total = *pvVar5;
        }
      }
      sVar6 = std::vector<float,_std::allocator<float>_>::size
                        ((vector<float,_std::allocator<float>_> *)local_30);
      local_17c = (float)sVar6;
      printf("min %.1fus  max %.1fus  avg %.1fus\n",(double)total,(double)local_120,
             (double)(i_1._4_4_ / local_17c));
    }
    argv_local._4_4_ = 0;
    parser.options_ = (DepfileParserOptions)0x1;
    parser._49_3_ = 0;
LAB_00107444:
    std::vector<float,_std::allocator<float>_>::~vector
              ((vector<float,_std::allocator<float>_> *)local_30);
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char* argv[]) {
  if (argc < 2) {
    printf("usage: %s <file1> <file2...>\n", argv[0]);
    return 1;
  }

  vector<float> times;
  for (int i = 1; i < argc; ++i) {
    const char* filename = argv[i];

    for (int limit = 1 << 10; limit < (1<<20); limit *= 2) {
      int64_t start = GetTimeMillis();
      for (int rep = 0; rep < limit; ++rep) {
        string buf;
        string err;
        if (ReadFile(filename, &buf, &err) < 0) {
          printf("%s: %s\n", filename, err.c_str());
          return 1;
        }

        DepfileParser parser;
        if (!parser.Parse(&buf, &err)) {
          printf("%s: %s\n", filename, err.c_str());
          return 1;
        }
      }
      int64_t end = GetTimeMillis();

      if (end - start > 100) {
        int delta = (int)(end - start);
        float time = delta*1000 / (float)limit;
        printf("%s: %.1fus\n", filename, time);
        times.push_back(time);
        break;
      }
    }
  }

  if (!times.empty()) {
    float min = times[0];
    float max = times[0];
    float total = 0;
    for (size_t i = 0; i < times.size(); ++i) {
      total += times[i];
      if (times[i] < min)
        min = times[i];
      else if (times[i] > max)
        max = times[i];
    }

    printf("min %.1fus  max %.1fus  avg %.1fus\n",
           min, max, total / times.size());
  }

  return 0;
}